

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  bool bVar2;
  xmlChar *local_40;
  xmlChar *defaultValue;
  int local_30;
  int def;
  int type;
  int inputid;
  xmlEnumerationPtr tree;
  xmlChar *attrName;
  xmlChar *elemName;
  xmlParserCtxtPtr ctxt_local;
  
  if (((((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
         (ctxt->input->cur[1] == '!')) &&
        ((ctxt->input->cur[2] == 'A' && (ctxt->input->cur[3] == 'T')))) &&
       (ctxt->input->cur[4] == 'T')) &&
      (((ctxt->input->cur[5] == 'L' && (ctxt->input->cur[6] == 'I')) &&
       ((ctxt->input->cur[7] == 'S' && (ctxt->input->cur[8] == 'T')))))) ||
     (((((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '!')) &&
        (ctxt->input->cur[1] == 'A')) &&
       ((ctxt->input->cur[2] == 'T' && (ctxt->input->cur[3] == 'T')))) &&
      ((ctxt->input->cur[4] == 'L' &&
       (((ctxt->input->cur[5] == 'I' && (ctxt->input->cur[6] == 'S')) &&
        (ctxt->input->cur[7] == 'T')))))))) {
    def = ctxt->input->id;
    iVar1 = 8;
    if (ctxt->mlType == XML_TYPE_XML) {
      iVar1 = 9;
    }
    ctxt->input->cur = ctxt->input->cur + iVar1;
    iVar1 = 8;
    if (ctxt->mlType == XML_TYPE_XML) {
      iVar1 = 9;
    }
    ctxt->input->col = iVar1 + ctxt->input->col;
    elemName = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    iVar1 = xmlSkipBlankChars((xmlParserCtxtPtr)elemName);
    if (iVar1 == 0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                     "Space required after \'<!ATTLIST\'\n");
    }
    attrName = xmlParseName((xmlParserCtxtPtr)elemName);
    if (attrName == (xmlChar *)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_NAME_REQUIRED,
                     "ATTLIST: no name for Element\n");
    }
    else {
      xmlSkipBlankChars((xmlParserCtxtPtr)elemName);
      if ((*(int *)(elemName + 0x1c4) == 0) &&
         (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
          *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
        xmlGROW((xmlParserCtxtPtr)elemName);
      }
      while( true ) {
        if (((*(int *)(elemName + 0x2f0) != 1) ||
            (bVar2 = false, **(char **)(*(long *)(elemName + 0x38) + 0x20) != '>')) &&
           ((*(int *)(elemName + 0x2f0) != 2 ||
            ((bVar2 = false, **(char **)(*(long *)(elemName + 0x38) + 0x20) != '\n' &&
             (bVar2 = false, **(char **)(*(long *)(elemName + 0x38) + 0x20) != ';')))))) {
          bVar2 = *(int *)(elemName + 0x110) != -1;
        }
        if (!bVar2) goto LAB_00181690;
        local_40 = (xmlChar *)0x0;
        if ((*(int *)(elemName + 0x1c4) == 0) &&
           (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
            *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
          xmlGROW((xmlParserCtxtPtr)elemName);
        }
        _type = (xmlEnumerationPtr)0x0;
        tree = (xmlEnumerationPtr)xmlParseName((xmlParserCtxtPtr)elemName);
        if (tree == (xmlEnumerationPtr)0x0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_NAME_REQUIRED,
                         "ATTLIST: no name for Attribute\n");
          goto LAB_00181690;
        }
        if ((*(int *)(elemName + 0x1c4) == 0) &&
           (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
            *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
          xmlGROW((xmlParserCtxtPtr)elemName);
        }
        iVar1 = xmlSkipBlankChars((xmlParserCtxtPtr)elemName);
        if (iVar1 == 0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                         "Space required after the attribute name\n");
          goto LAB_00181690;
        }
        local_30 = xmlParseAttributeType((xmlParserCtxtPtr)elemName,(xmlEnumerationPtr *)&type);
        if (local_30 < 1) goto LAB_00181690;
        if ((*(int *)(elemName + 0x1c4) == 0) &&
           (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
            *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
          xmlGROW((xmlParserCtxtPtr)elemName);
        }
        iVar1 = xmlSkipBlankChars((xmlParserCtxtPtr)elemName);
        if (iVar1 == 0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                         "Space required after the attribute type\n");
          if (_type != (xmlEnumerationPtr)0x0) {
            xmlFreeEnumeration(_type);
          }
          goto LAB_00181690;
        }
        defaultValue._4_4_ = xmlParseDefaultDecl((xmlParserCtxtPtr)elemName,&local_40);
        if (defaultValue._4_4_ < 1) {
          if (local_40 != (xmlChar *)0x0) {
            (*xmlFree)(local_40);
          }
          if (_type != (xmlEnumerationPtr)0x0) {
            xmlFreeEnumeration(_type);
          }
          goto LAB_00181690;
        }
        if ((local_30 != 1) && (local_40 != (xmlChar *)0x0)) {
          xmlAttrNormalizeSpace(local_40,local_40);
        }
        if ((*(int *)(elemName + 0x1c4) == 0) &&
           (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
            *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
          xmlGROW((xmlParserCtxtPtr)elemName);
        }
        if ((((*(int *)(elemName + 0x2f0) != 1) ||
             (**(char **)(*(long *)(elemName + 0x38) + 0x20) != '>')) &&
            ((*(int *)(elemName + 0x2f0) != 2 ||
             ((**(char **)(*(long *)(elemName + 0x38) + 0x20) != '\n' &&
              (**(char **)(*(long *)(elemName + 0x38) + 0x20) != ';')))))) &&
           (iVar1 = xmlSkipBlankChars((xmlParserCtxtPtr)elemName), iVar1 == 0)) break;
        if (((*(long *)elemName == 0) || (*(int *)(elemName + 0x14c) != 0)) ||
           (*(long *)(*(long *)elemName + 0x40) == 0)) {
          if (_type != (xmlEnumerationPtr)0x0) {
            xmlFreeEnumeration(_type);
          }
        }
        else {
          (**(code **)(*(long *)elemName + 0x40))
                    (*(undefined8 *)(elemName + 8),attrName,tree,local_30,defaultValue._4_4_,
                     local_40,_type);
        }
        if (((*(int *)(elemName + 0x1f8) != 0) && (local_40 != (xmlChar *)0x0)) &&
           ((defaultValue._4_4_ != 3 && (defaultValue._4_4_ != 2)))) {
          xmlAddDefAttrs((xmlParserCtxtPtr)elemName,attrName,(xmlChar *)tree,local_40);
        }
        if (*(int *)(elemName + 0x1f8) != 0) {
          xmlAddSpecialAttr((xmlParserCtxtPtr)elemName,attrName,(xmlChar *)tree,local_30);
        }
        if (local_40 != (xmlChar *)0x0) {
          (*xmlFree)(local_40);
        }
        if ((*(int *)(elemName + 0x1c4) == 0) &&
           (*(long *)(*(long *)(elemName + 0x38) + 0x28) -
            *(long *)(*(long *)(elemName + 0x38) + 0x20) < 0xfa)) {
          xmlGROW((xmlParserCtxtPtr)elemName);
        }
      }
      xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_SPACE_REQUIRED,
                     "Space required after the attribute default value\n");
      if (local_40 != (xmlChar *)0x0) {
        (*xmlFree)(local_40);
      }
      if (_type != (xmlEnumerationPtr)0x0) {
        xmlFreeEnumeration(_type);
      }
LAB_00181690:
      if (((*(int *)(elemName + 0x2f0) == 1) &&
          (**(char **)(*(long *)(elemName + 0x38) + 0x20) == '>')) ||
         ((*(int *)(elemName + 0x2f0) == 2 &&
          ((**(char **)(*(long *)(elemName + 0x38) + 0x20) == '\n' ||
           (**(char **)(*(long *)(elemName + 0x38) + 0x20) == ';')))))) {
        if (def != *(int *)(*(long *)(elemName + 0x38) + 100)) {
          xmlFatalErrMsg((xmlParserCtxtPtr)elemName,XML_ERR_ENTITY_BOUNDARY,
                         "Attribute list declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar((xmlParserCtxtPtr)elemName);
      }
    }
  }
  return;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    DEBUG_ENTER(("xmlParseAttributeListDecl(%s);\n", dbgCtxt(ctxt)));

    if (CMP9_MLI(CUR_PTR, '<', '!', 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP_MLI(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    RETURN();
	}
	SKIP_BLANKS;
	GROW;
	while ((!RAW_IS_GT_MLI) && (ctxt->instate != XML_PARSER_EOF)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (!RAW_IS_GT_MLI) { /* RAW != '>' */
		if (SKIP_BLANKS == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW_IS_GT_MLI) { /* RAW == '>' */
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
    RETURN();
}